

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  long lVar6;
  bool bVar7;
  AABBNodeMB4D *node1;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  InstancePrimitive *prim;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  Precalculations pre;
  NodeRef stack [244];
  Precalculations local_881;
  Ray *local_880;
  ulong local_878;
  ulong *local_870;
  RayQueryContext *local_868;
  long local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      local_870 = local_7d0;
      auVar18 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar17._8_4_ = 0x7fffffff;
      auVar17._0_8_ = 0x7fffffff7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx((undefined1  [16])aVar5,auVar17);
      auVar36._8_4_ = 0x219392ef;
      auVar36._0_8_ = 0x219392ef219392ef;
      auVar36._12_4_ = 0x219392ef;
      auVar17 = vcmpps_avx(auVar17,auVar36,1);
      auVar17 = vblendvps_avx((undefined1  [16])aVar5,auVar36,auVar17);
      auVar36 = vrcpps_avx(auVar17);
      fVar30 = auVar36._0_4_;
      auVar23._0_4_ = fVar30 * auVar17._0_4_;
      fVar33 = auVar36._4_4_;
      auVar23._4_4_ = fVar33 * auVar17._4_4_;
      fVar34 = auVar36._8_4_;
      auVar23._8_4_ = fVar34 * auVar17._8_4_;
      fVar35 = auVar36._12_4_;
      auVar23._12_4_ = fVar35 * auVar17._12_4_;
      auVar37._8_4_ = 0x3f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      auVar37._12_4_ = 0x3f800000;
      auVar17 = vsubps_avx(auVar37,auVar23);
      auVar24._0_4_ = fVar30 + fVar30 * auVar17._0_4_;
      auVar24._4_4_ = fVar33 + fVar33 * auVar17._4_4_;
      auVar24._8_4_ = fVar34 + fVar34 * auVar17._8_4_;
      auVar24._12_4_ = fVar35 + fVar35 * auVar17._12_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_7e8._4_4_ = uVar4;
      local_7e8._0_4_ = uVar4;
      local_7e8._8_4_ = uVar4;
      local_7e8._12_4_ = uVar4;
      auVar39 = ZEXT1664(local_7e8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_7f8._4_4_ = uVar4;
      local_7f8._0_4_ = uVar4;
      local_7f8._8_4_ = uVar4;
      local_7f8._12_4_ = uVar4;
      auVar40 = ZEXT1664(local_7f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_808._4_4_ = uVar4;
      local_808._0_4_ = uVar4;
      local_808._8_4_ = uVar4;
      local_808._12_4_ = uVar4;
      auVar41 = ZEXT1664(local_808);
      local_818 = vshufps_avx(auVar24,auVar24,0);
      auVar42 = ZEXT1664(local_818);
      auVar17 = vmovshdup_avx(auVar24);
      local_828 = vshufps_avx(auVar24,auVar24,0x55);
      auVar43 = ZEXT1664(local_828);
      auVar36 = vshufpd_avx(auVar24,auVar24,1);
      local_878 = (ulong)(auVar24._0_4_ < 0.0) << 4;
      local_838 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar44 = ZEXT1664(local_838);
      uVar11 = (ulong)(auVar17._0_4_ < 0.0) << 4 | 0x20;
      uVar15 = (ulong)(auVar36._0_4_ < 0.0) << 4 | 0x40;
      uVar12 = local_878 ^ 0x10;
      local_848 = vshufps_avx(auVar18,auVar18,0);
      auVar38 = ZEXT1664(local_848);
      local_858 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar45 = ZEXT1664(local_858);
      uVar13 = local_878;
      local_880 = ray;
      local_868 = context;
LAB_002ca79b:
      do {
        uVar14 = local_870[-1];
        local_870 = local_870 + -1;
        while ((uVar14 & 8) == 0) {
          uVar8 = uVar14 & 0xfffffffffffffff0;
          fVar3 = (ray->dir).field_0.m128[3];
          auVar16._4_4_ = fVar3;
          auVar16._0_4_ = fVar3;
          auVar16._8_4_ = fVar3;
          auVar16._12_4_ = fVar3;
          pfVar2 = (float *)(uVar8 + 0x80 + uVar13);
          pfVar1 = (float *)(uVar8 + 0x20 + uVar13);
          auVar18._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar18._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar18._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar18._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar17 = vsubps_avx(auVar18,auVar39._0_16_);
          auVar19._0_4_ = auVar42._0_4_ * auVar17._0_4_;
          auVar19._4_4_ = auVar42._4_4_ * auVar17._4_4_;
          auVar19._8_4_ = auVar42._8_4_ * auVar17._8_4_;
          auVar19._12_4_ = auVar42._12_4_ * auVar17._12_4_;
          pfVar2 = (float *)(uVar8 + 0x80 + uVar11);
          auVar17 = vmaxps_avx(auVar38._0_16_,auVar19);
          pfVar1 = (float *)(uVar8 + 0x20 + uVar11);
          auVar20._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar20._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar20._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar20._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar18 = vsubps_avx(auVar20,auVar40._0_16_);
          pfVar2 = (float *)(uVar8 + 0x80 + uVar15);
          pfVar1 = (float *)(uVar8 + 0x20 + uVar15);
          auVar25._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar25._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar25._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar25._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar21._0_4_ = auVar43._0_4_ * auVar18._0_4_;
          auVar21._4_4_ = auVar43._4_4_ * auVar18._4_4_;
          auVar21._8_4_ = auVar43._8_4_ * auVar18._8_4_;
          auVar21._12_4_ = auVar43._12_4_ * auVar18._12_4_;
          auVar18 = vsubps_avx(auVar25,auVar41._0_16_);
          auVar26._0_4_ = auVar44._0_4_ * auVar18._0_4_;
          auVar26._4_4_ = auVar44._4_4_ * auVar18._4_4_;
          auVar26._8_4_ = auVar44._8_4_ * auVar18._8_4_;
          auVar26._12_4_ = auVar44._12_4_ * auVar18._12_4_;
          auVar18 = vmaxps_avx(auVar21,auVar26);
          pfVar2 = (float *)(uVar8 + 0x80 + uVar12);
          pfVar1 = (float *)(uVar8 + 0x20 + uVar12);
          auVar27._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar27._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar27._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar27._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar17 = vmaxps_avx(auVar17,auVar18);
          auVar18 = vsubps_avx(auVar27,auVar39._0_16_);
          auVar22._0_4_ = auVar42._0_4_ * auVar18._0_4_;
          auVar22._4_4_ = auVar42._4_4_ * auVar18._4_4_;
          auVar22._8_4_ = auVar42._8_4_ * auVar18._8_4_;
          auVar22._12_4_ = auVar42._12_4_ * auVar18._12_4_;
          auVar18 = vminps_avx(auVar45._0_16_,auVar22);
          pfVar2 = (float *)(uVar8 + 0x80 + (uVar11 ^ 0x10));
          pfVar1 = (float *)(uVar8 + 0x20 + (uVar11 ^ 0x10));
          auVar28._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar28._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar28._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar28._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar36 = vsubps_avx(auVar28,auVar40._0_16_);
          auVar29._0_4_ = auVar43._0_4_ * auVar36._0_4_;
          auVar29._4_4_ = auVar43._4_4_ * auVar36._4_4_;
          auVar29._8_4_ = auVar43._8_4_ * auVar36._8_4_;
          auVar29._12_4_ = auVar43._12_4_ * auVar36._12_4_;
          pfVar2 = (float *)(uVar8 + 0x80 + (uVar15 ^ 0x10));
          pfVar1 = (float *)(uVar8 + 0x20 + (uVar15 ^ 0x10));
          auVar31._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar31._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar31._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar31._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar36 = vsubps_avx(auVar31,auVar41._0_16_);
          auVar32._0_4_ = auVar44._0_4_ * auVar36._0_4_;
          auVar32._4_4_ = auVar44._4_4_ * auVar36._4_4_;
          auVar32._8_4_ = auVar44._8_4_ * auVar36._8_4_;
          auVar32._12_4_ = auVar44._12_4_ * auVar36._12_4_;
          auVar36 = vminps_avx(auVar29,auVar32);
          auVar18 = vminps_avx(auVar18,auVar36);
          if (((uint)uVar14 & 7) == 6) {
            auVar18 = vcmpps_avx(auVar17,auVar18,2);
            auVar17 = vcmpps_avx(*(undefined1 (*) [16])(uVar8 + 0xe0),auVar16,2);
            auVar36 = vcmpps_avx(auVar16,*(undefined1 (*) [16])(uVar8 + 0xf0),1);
            auVar17 = vandps_avx(auVar17,auVar36);
            auVar17 = vandps_avx(auVar17,auVar18);
          }
          else {
            auVar17 = vcmpps_avx(auVar17,auVar18,2);
          }
          auVar17 = vpslld_avx(auVar17,0x1f);
          uVar9 = vmovmskps_avx(auVar17);
          if (uVar9 == 0) {
            if (local_870 == &local_7d8) {
              return;
            }
            goto LAB_002ca79b;
          }
          uVar9 = uVar9 & 0xff;
          lVar6 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar14 = *(ulong *)(uVar8 + lVar6 * 8);
          uVar9 = uVar9 - 1 & uVar9;
          if (uVar9 != 0) {
            *local_870 = uVar14;
            local_870 = local_870 + 1;
            lVar6 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar14 = *(ulong *)(uVar8 + lVar6 * 8);
            uVar9 = uVar9 - 1 & uVar9;
            uVar10 = (ulong)uVar9;
            if (uVar9 != 0) {
              do {
                *local_870 = uVar14;
                local_870 = local_870 + 1;
                lVar6 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                uVar14 = *(ulong *)(uVar8 + lVar6 * 8);
                uVar10 = uVar10 & uVar10 - 1;
              } while (uVar10 != 0);
            }
          }
        }
        local_860 = (ulong)((uint)uVar14 & 0xf) - 8;
        if (local_860 != 0) {
          prim = (InstancePrimitive *)(uVar14 & 0xfffffffffffffff0);
          do {
            bVar7 = InstanceIntersector1MB::occluded(&local_881,ray,local_868,prim);
            if (bVar7) {
              local_880->tfar = -INFINITY;
              return;
            }
            prim = prim + 1;
            local_860 = local_860 + -1;
            ray = local_880;
          } while (local_860 != 0);
        }
        auVar39 = ZEXT1664(local_7e8);
        auVar40 = ZEXT1664(local_7f8);
        auVar41 = ZEXT1664(local_808);
        auVar42 = ZEXT1664(local_818);
        auVar43 = ZEXT1664(local_828);
        auVar44 = ZEXT1664(local_838);
        auVar38 = ZEXT1664(local_848);
        auVar45 = ZEXT1664(local_858);
        uVar13 = local_878;
      } while (local_870 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }